

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O2

void __thiscall zmq::session_base_t::timer_event(session_base_t *this,int id_)

{
  pipe_t *this_00;
  
  if (id_ != 0x20) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","id_ == linger_timer_id",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0x225);
    fflush(_stderr);
    zmq_abort("id_ == linger_timer_id");
  }
  this->_has_linger_timer = false;
  this_00 = this->_pipe;
  if (this_00 == (pipe_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_pipe",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0x229);
    fflush(_stderr);
    zmq_abort("_pipe");
    this_00 = this->_pipe;
  }
  pipe_t::terminate(this_00,false);
  return;
}

Assistant:

void zmq::session_base_t::timer_event (int id_)
{
    //  Linger period expired. We can proceed with termination even though
    //  there are still pending messages to be sent.
    zmq_assert (id_ == linger_timer_id);
    _has_linger_timer = false;

    //  Ask pipe to terminate even though there may be pending messages in it.
    zmq_assert (_pipe);
    _pipe->terminate (false);
}